

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void reuse_on_delete_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  char *pcVar3;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  char bodybuf [512];
  char keybuf [256];
  int nheaders;
  int ndocs;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffff9e8;
  fdb_file_handle *in_stack_fffffffffffff9f0;
  FILE *pFVar4;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  void *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  fdb_file_info *in_stack_fffffffffffffa20;
  void *key;
  fdb_kvs_handle *in_stack_fffffffffffffa28;
  fdb_kvs_handle *handle;
  fdb_config *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  fdb_file_handle **in_stack_fffffffffffffc18;
  ulong local_3a8;
  void *local_380;
  char local_368 [512];
  undefined1 local_168 [352];
  size_t local_8;
  
  gettimeofday((timeval *)(local_168 + 0x158),(__timezone_ptr_t)0x0);
  local_168._312_8_ = local_168._344_8_;
  local_168._320_8_ = local_8;
  memleak_start();
  local_168._264_4_ = 10;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_168._272_4_ = system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  fdb_kvs_open_default
            (in_stack_fffffffffffff9f0,&in_stack_fffffffffffff9e8->root,(fdb_kvs_config *)0x10e422);
  for (local_168._276_4_ = 0; (int)local_168._276_4_ < local_168._264_4_ + 1;
      local_168._276_4_ = local_168._276_4_ + 1) {
    sprintf(local_168,"%dkey",(ulong)(uint)local_168._276_4_);
    fillstr(local_368,'b',0x200);
    strlen(local_168);
    strlen(local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                       in_stack_fffffffffffffa10,
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4bd);
      reuse_on_delete_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4bd,"void reuse_on_delete_test()");
    }
    fVar1 = fdb_commit(in_stack_fffffffffffff9e8,'\0');
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4bf);
      reuse_on_delete_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4bf,"void reuse_on_delete_test()");
    }
  }
  local_168._276_4_ = 0;
  do {
    sprintf(local_168,"%dkey",(ulong)(uint)local_168._276_4_);
    fillstr(local_368,'c',0x80);
    strlen(local_168);
    strlen(local_368);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                       in_stack_fffffffffffffa10,
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4c9);
      reuse_on_delete_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4c9,"void reuse_on_delete_test()");
    }
    local_168._276_4_ = local_168._276_4_ + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20
                             );
    pFVar4 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4cc);
      reuse_on_delete_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4cc,"void reuse_on_delete_test()");
    }
  } while (local_3a8 < 0x1000000);
  local_168._268_4_ = local_168._276_4_;
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                    );
  if (sVar2 != SBD_NONE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x4d2);
    reuse_on_delete_test::__test_pass = 0;
    if (sVar2 != SBD_NONE) {
      __assert_fail("sb_decision == SBD_NONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4d2,"void reuse_on_delete_test()");
    }
  }
  fVar1 = fdb_commit(in_stack_fffffffffffff9e8,'\0');
  pFVar4 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    for (local_168._276_4_ = 0; (int)local_168._276_4_ < (int)local_168._268_4_;
        local_168._276_4_ = local_168._276_4_ + 1) {
      sprintf(local_168,"%dkey",(ulong)(uint)local_168._276_4_);
      strlen(local_168);
      fVar1 = fdb_del_kv((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                         in_stack_fffffffffffffa10,
                         CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      pFVar4 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4da);
        reuse_on_delete_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4da,"void reuse_on_delete_test()");
      }
    }
    sVar2 = sb_check_block_reusing
                      ((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    if (sVar2 != SBD_RECLAIM) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4de);
      reuse_on_delete_test::__test_pass = 0;
      if (sVar2 != SBD_RECLAIM) {
        __assert_fail("sb_decision == SBD_RECLAIM",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4de,"void reuse_on_delete_test()");
      }
    }
    for (local_168._276_4_ = 0; (int)local_168._276_4_ < (int)local_168._268_4_ / 4;
        local_168._276_4_ = local_168._276_4_ + 2) {
      sprintf(local_168,"%dkey",(ulong)(uint)local_168._276_4_);
      fillstr(local_368,'d',0x80);
      handle = (fdb_kvs_handle *)local_168;
      key = local_380;
      strlen(local_168);
      strlen(local_368);
      fVar1 = fdb_set_kv(handle,key,CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                         in_stack_fffffffffffffa10,
                         CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pFVar4 = _stderr;
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4e7);
        reuse_on_delete_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4e7,"void reuse_on_delete_test()");
      }
    }
    sVar2 = sb_check_block_reusing
                      ((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    if (sVar2 != SBD_RECLAIM) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4ed);
      reuse_on_delete_test::__test_pass = 0;
      if (sVar2 != SBD_RECLAIM) {
        __assert_fail("sb_decision == SBD_RECLAIM",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4ed,"void reuse_on_delete_test()");
      }
    }
    fVar1 = fdb_close(in_stack_fffffffffffff9e8);
    pFVar4 = _stderr;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        if (reuse_on_delete_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","reuse on delete test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","reuse on delete test");
        }
        return;
      }
      pFVar4 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4f2);
      reuse_on_delete_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4f2,"void reuse_on_delete_test()");
    }
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x4f0);
    reuse_on_delete_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x4f0,"void reuse_on_delete_test()");
  }
  pcVar3 = fdb_error_msg(fVar1);
  fprintf(pFVar4,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x4d4);
  reuse_on_delete_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4d4,"void reuse_on_delete_test()");
}

Assistant:

void reuse_on_delete_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect NO REUSE
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // delete so that file becomes stale
    for (i = 0; i < ndocs; ++i) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reload 1/4 all keys again and expect no file size growth
    // since all docs being reused
    for (i = 0; i < ndocs / 4; ++i) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
    }

    // expect to still be in reuse mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("reuse on delete test");
}